

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O1

ON_SHA1_Hash *
ON_SHA1_Hash::FromString
          (ON_SHA1_Hash *__return_storage_ptr__,ON_wString string_to_parse,bool bParseLeasingSpaces,
          bool bParseInteriorSpace,bool bParseInteriorHyphen,ON_SHA1_Hash failure_return_value)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  int j;
  uint uVar3;
  wchar_t *pwVar4;
  long lVar5;
  uint uVar6;
  wchar_t *pwVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  uint local_d8 [42];
  
  pwVar4 = ON_wString::operator_cast_to_wchar_t_(string_to_parse.m_s);
  if (pwVar4 == (wchar_t *)0x0) {
    *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) = failure_return_value.m_digest._16_4_;
    goto LAB_005b7bf4;
  }
  uVar9 = 0;
  memset(local_d8,0,0xa0);
  uVar3 = ON_wString::Length((ON_wString *)string_to_parse.m_s);
  bVar12 = 0 < (int)uVar3;
  if (0 < (int)uVar3) {
    uVar11 = 0;
    uVar6 = 0;
    pwVar7 = (wchar_t *)0x0;
    do {
      wVar1 = pwVar4[uVar11];
      uVar9 = wVar1 + L'\xffffffd0';
      if (uVar9 < 10) {
LAB_005b7b3a:
        uVar10 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
        local_d8[uVar10] = uVar9;
        pwVar2 = pwVar7;
LAB_005b7b47:
        pwVar7 = pwVar2;
        bVar13 = false;
      }
      else {
        if ((uint)(wVar1 + L'\xffffffbf') < 6) {
          uVar9 = wVar1 + L'\xffffffc9';
          goto LAB_005b7b3a;
        }
        if ((uint)(wVar1 + L'\xffffff9f') < 6) {
          uVar9 = wVar1 + L'\xffffffa9';
          goto LAB_005b7b3a;
        }
        bVar13 = true;
        if (wVar1 == L'-') {
          bVar8 = uVar6 == 0 || !bParseInteriorHyphen;
LAB_005b7b9b:
          pwVar2 = pwVar4;
          if (pwVar7 == pwVar4 + -1 || bVar8) goto LAB_005b7b4d;
          goto LAB_005b7b47;
        }
        if (wVar1 == L' ') {
          if (!bParseLeasingSpaces || uVar6 != 0) {
            bVar8 = uVar6 == 0 || !bParseInteriorSpace;
            goto LAB_005b7b9b;
          }
          uVar6 = 0;
          bVar13 = false;
        }
      }
LAB_005b7b4d:
      if (bVar13) goto LAB_005b7bac;
      uVar11 = uVar11 + 1;
      bVar12 = uVar11 < uVar3;
      if ((!bVar12) || (0x27 < uVar6)) goto LAB_005b7bac;
    } while( true );
  }
  bVar13 = true;
  goto LAB_005b7bc5;
LAB_005b7bac:
  uVar9 = (uint)uVar11;
  bVar13 = uVar6 != 0x28;
LAB_005b7bc5:
  if ((((int)uVar9 <= (int)uVar3) && (!bVar13)) &&
     ((!bVar12 || (bVar12 = ON_wString::IsHexDigit(pwVar4[uVar9]), !bVar12)))) {
    ON_SHA1_Hash(__return_storage_ptr__);
    lVar5 = 0;
    do {
      __return_storage_ptr__->m_digest[lVar5] =
           (char)(local_d8[lVar5 * 2] << 4) + (char)local_d8[lVar5 * 2 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x14);
    return __return_storage_ptr__;
  }
  *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) = failure_return_value.m_digest._16_4_;
LAB_005b7bf4:
  *(undefined4 *)__return_storage_ptr__->m_digest = failure_return_value.m_digest._0_4_;
  *(undefined4 *)(__return_storage_ptr__->m_digest + 4) = failure_return_value.m_digest._4_4_;
  *(undefined4 *)(__return_storage_ptr__->m_digest + 8) = failure_return_value.m_digest._8_4_;
  *(undefined4 *)(__return_storage_ptr__->m_digest + 0xc) = failure_return_value.m_digest._12_4_;
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SHA1_Hash::FromString(
  const ON_wString string_to_parse,
  bool bParseLeasingSpaces,
  bool bParseInteriorSpace,
  bool bParseInteriorHyphen,
  ON_SHA1_Hash failure_return_value
)
{
  const wchar_t* s = static_cast<const wchar_t*>(string_to_parse);
  if (nullptr == s)
    return failure_return_value;

  unsigned digit_count = 0;
  int digits[40] = {};
  const wchar_t* skipped = nullptr;
  const int len = string_to_parse.Length();
  int sdex = 0;
  for (/* empty init */; sdex < len && digit_count < 40; ++sdex)
  {
    const int c = (int)s[sdex];
    if (c >= '0' && c <= '9')
    {
      digits[digit_count++] = (c - '0');
    }
    else if (c >= 'A' && c <= 'F')
    {
      digits[digit_count++] = (c - 'A') + 10;
    }
    else if (c >= 'a' && c <= 'f')
    {
      digits[digit_count++] = (c - 'a') + 10;
    }
    else  if ((int)(ON_wString::Space) == c)
    {
      if (bParseLeasingSpaces && 0 == digit_count)
        continue; // skip leading white space

      if (bParseInteriorSpace && digit_count > 0 && skipped != s - 1)
        skipped = s;
      else
        break;
    }
    else  if ((int)(ON_wString::HyphenMinus) == c)
    {
      if (bParseInteriorHyphen && digit_count > 0 && skipped != s - 1)
        skipped = s;
      else
        break;
    }
    else
      break;
  }

  if (40 != digit_count || sdex > len || (sdex < len && true == ON_wString::IsHexDigit(s[sdex])))
    return failure_return_value;

  ON_SHA1_Hash h;
  int i = 0;
  for(int j = 0; j < 20; ++j, ++i, ++i)
    h.m_digest[j] = (ON__UINT8)(16 * digits[i] + digits[i + 1]);
  return h;
}